

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_buffers.cpp
# Opt level: O3

shared_ptr<polyscope::render::TextureBuffer>
polyscope::render::generateTextureBuffer<unsigned_int>(DeviceBufferType D,Engine *engine)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined4 in_register_0000003c;
  Engine *engine_00;
  shared_ptr<polyscope::render::TextureBuffer> sVar1;
  string local_38;
  
  engine_00 = (Engine *)CONCAT44(in_register_0000003c,D);
  switch((ulong)engine & 0xffffffff) {
  case 0:
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"bad call","");
    exception(&local_38);
    in_RDX._M_pi = extraout_RDX;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
      in_RDX._M_pi = extraout_RDX_00;
    }
  default:
    engine_00->_vptr_Engine = (_func_int **)0x0;
    (engine_00->groundPlane).groundPlaneProgram.
    super___shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    break;
  case 1:
    sVar1 = generateTextureBuffer<unsigned_int,(polyscope::DeviceBufferType)1>(engine_00);
    in_RDX = sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    break;
  case 2:
    sVar1 = generateTextureBuffer<unsigned_int,(polyscope::DeviceBufferType)2>(engine_00);
    in_RDX = sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    break;
  case 3:
    sVar1 = generateTextureBuffer<unsigned_int,(polyscope::DeviceBufferType)3>(engine_00);
    in_RDX = sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  }
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = in_RDX._M_pi;
  sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)engine_00;
  return (shared_ptr<polyscope::render::TextureBuffer>)
         sVar1.super___shared_ptr<polyscope::render::TextureBuffer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TextureBuffer> generateTextureBuffer(DeviceBufferType D, Engine* engine) {
  switch (D) {
  case DeviceBufferType::Attribute:
    exception("bad call");
    break;
  case DeviceBufferType::Texture1d:
    return generateTextureBuffer<T, DeviceBufferType::Texture1d>(engine);
    break;
  case DeviceBufferType::Texture2d:
    return generateTextureBuffer<T, DeviceBufferType::Texture2d>(engine);
    break;
  case DeviceBufferType::Texture3d:
    return generateTextureBuffer<T, DeviceBufferType::Texture3d>(engine);
    break;
  }
  return nullptr;
}